

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UnaryExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange,slang::SourceRange>
          (BumpAllocator *this,UnaryOperator *args,Type *args_1,Expression *args_2,
          SourceRange *args_3,SourceRange *args_4)

{
  UnaryOperator UVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  SourceLocation SVar5;
  UnaryExpression *pUVar6;
  
  pUVar6 = (UnaryExpression *)allocate(this,0x50,8);
  UVar1 = *args;
  SVar2 = args_3->startLoc;
  SVar3 = args_3->endLoc;
  SVar4 = args_4->startLoc;
  SVar5 = args_4->endLoc;
  (pUVar6->super_Expression).kind = UnaryOp;
  (pUVar6->super_Expression).type.ptr = args_1;
  (pUVar6->super_Expression).constant = (ConstantValue *)0x0;
  (pUVar6->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pUVar6->super_Expression).sourceRange.startLoc = SVar2;
  (pUVar6->super_Expression).sourceRange.endLoc = SVar3;
  pUVar6->op = UVar1;
  (pUVar6->opRange).startLoc = SVar4;
  (pUVar6->opRange).endLoc = SVar5;
  pUVar6->operand_ = args_2;
  return pUVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }